

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cc
# Opt level: O3

void __thiscall kratos::PassManager::run_passes(PassManager *this,Generator *generator)

{
  key_type *pkVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  mapped_type *__x;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fn_name;
  key_type *pkVar6;
  _Manager_operation extraout_EDX;
  key_type *__k;
  undefined1 local_70 [8];
  mapped_type fn;
  ulong local_38;
  
  __k = *(key_type **)(this + 0x30);
  pkVar1 = *(key_type **)(this + 0x38);
  if (this[0x48] == (PassManager)0x1) {
    if (__k == pkVar1) {
      return;
    }
    uVar4 = 0;
    pkVar6 = __k;
    do {
      uVar3 = (uint)pkVar6->_M_string_length;
      if ((int)uVar3 < (int)uVar4) {
        uVar3 = uVar4;
      }
      uVar4 = uVar3;
      pkVar6 = pkVar6 + 1;
    } while (pkVar6 != pkVar1);
    local_38 = (ulong)uVar4;
  }
  else {
    local_38 = 0;
  }
  if (__k != pkVar1) {
    do {
      __x = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>_>
            ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>_>
                  *)this,__k);
      std::function<void_(kratos::Generator_*)>::function
                ((function<void_(kratos::Generator_*)> *)local_70,__x);
      std::chrono::_V2::system_clock::now();
      fn._M_invoker = (_Invoker_type)generator;
      if (fn.super__Function_base._M_functor._8_8_ == 0) {
        std::__throw_bad_function_call();
      }
      (*fn.super__Function_base._M_manager)
                ((_Any_data *)local_70,(_Any_data *)&fn._M_invoker,extraout_EDX);
      if (this[0x48] == (PassManager)0x1) {
        std::chrono::_V2::system_clock::now();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[name]: ",8);
        lVar2 = std::cout;
        *(uint *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
             = *(uint *)(std::__exception_ptr::exception_ptr::exception_ptr +
                        *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
        *(ulong *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar2 + -0x18)) = local_38;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(__k->_M_dataplus)._M_p,__k->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t[time]: ",9);
        poVar5 = std::ostream::_M_insert<long>((long)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ms",3);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      if (fn.super__Function_base._M_functor._8_8_ != 0) {
        (*(code *)fn.super__Function_base._M_functor._8_8_)
                  ((_Any_data *)local_70,(_Any_data *)local_70,3);
      }
      __k = __k + 1;
    } while (__k != pkVar1);
  }
  return;
}

Assistant:

void PassManager::run_passes(Generator* generator) {
    // compute padding
    int string_size = 0;
    if (collect_perf_) {
        for (auto const& fn_name : passes_order_) {
            auto s = static_cast<int>(fn_name.size());
            if (s > string_size) {
                string_size = s;
            }
        }
    }

    for (const auto& fn_name : passes_order_) {
        auto fn = passes_.at(fn_name);
        auto start = std::chrono::system_clock::now();
        fn(generator);

        if (collect_perf_) {
            auto end = std::chrono::system_clock::now();
            auto diff = end - start;
            auto time = std::chrono::duration_cast<std::chrono::milliseconds>(diff).count();
            std::cout << "[name]: " << std::left << std::setw(string_size) << fn_name
                      << "\t[time]: " << time << " ms" << std::endl;
        }
    }
}